

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnConstExpr
          (ExprVisitorDelegate *this,ConstExpr *expr)

{
  Enum EVar1;
  WatWriter *this_00;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  double dVar5;
  char buffer [128];
  char acStack_98 [128];
  
  EVar1 = (expr->const_).type_.enum_;
  if (4 < (uint)(EVar1 + ~I8)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wat-writer.cc"
                  ,0x1d9,"void wabt::(anonymous namespace)::WatWriter::WriteConst(const Const &)");
  }
  this_00 = this->writer_;
  switch(EVar1) {
  case V128:
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::V128Const_Opcode);
    WritePutsSpace(this_00,pcVar4);
    uVar2 = *(ulong *)(expr->const_).data_.v;
    uVar3 = *(ulong *)((expr->const_).data_.v + 8);
    Writef(this_00,"i32x4 0x%08x 0x%08x 0x%08x 0x%08x",uVar2,uVar2 >> 0x20,uVar3,uVar3 >> 0x20);
    break;
  case F64:
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::F64Const_Opcode);
    WritePutsSpace(this_00,pcVar4);
    WriteDoubleHex(acStack_98,0x80,*(uint64_t *)(expr->const_).data_.v);
    WritePutsSpace(this_00,acStack_98);
    dVar5 = *(double *)(expr->const_).data_.v;
    goto LAB_00174aca;
  case F32:
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::F32Const_Opcode);
    WritePutsSpace(this_00,pcVar4);
    WriteFloatHex(acStack_98,0x80,*(uint32_t *)(expr->const_).data_.v);
    WritePutsSpace(this_00,acStack_98);
    dVar5 = (double)*(float *)(expr->const_).data_.v;
LAB_00174aca:
    Writef(this_00,"(;=%g;)",dVar5);
    break;
  case I64:
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::I64Const_Opcode);
    WritePutsSpace(this_00,pcVar4);
    Writef(this_00,"%ld",*(undefined8 *)(expr->const_).data_.v);
    break;
  case I32:
    pcVar4 = Opcode::GetName((Opcode *)&Opcode::I32Const_Opcode);
    WritePutsSpace(this_00,pcVar4);
    Writef(this_00,"%d",(ulong)*(uint *)(expr->const_).data_.v);
  }
  WriteNewline(this_00,false);
  return (Result)Ok;
}

Assistant:

WatWriter(Stream* stream, const WriteWatOptions& options,
            const Module &module)
      : ModuleContext(module), options_(options), stream_(stream) {}